

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O2

int __thiscall DTSStreamReader::decodeHdInfo(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  DTSHD_SUBTYPE DVar12;
  int i;
  double dVar13;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  BitStreamReader::setBuffer(&reader,buff + 5,end);
  DVar12 = DTS_SUBTYPE_HIGH_RES;
  uVar4 = BitStreamReader::getBits(&reader,2);
  bVar1 = BitStreamReader::getBit(&reader);
  if (bVar1) {
    uVar5 = BitStreamReader::getBits(&reader,0xc);
    uVar6 = BitStreamReader::getBits(&reader,0x14);
    uVar5 = uVar5 & 0xffff;
  }
  else {
    uVar5 = BitStreamReader::getBits(&reader,8);
    uVar6 = BitStreamReader::getBits(&reader,0x10);
    uVar5 = uVar5 & 0xff;
    uVar6 = uVar6 & 0xffff;
  }
  iVar7 = uVar6 + 1;
  if (this->m_hdType == DTS_SUBTYPE_UNINITIALIZED) {
    if (end < buff + (ulong)uVar5 + 5) {
      iVar7 = -10;
    }
    else {
      uVar8 = my_ntohl(*(uint32_t *)(buff + (ulong)uVar5 + 1));
      if (uVar8 == 0xa801921) {
        DVar12 = DTS_SUBTYPE_EXPRESS;
      }
      else if (uVar8 == 0x1d95f262) {
        DVar12 = DTS_SUBTYPE_96;
      }
      else if (uVar8 == 0x41a29547) {
        DVar12 = DTS_SUBTYPE_MASTER_AUDIO;
      }
      else if ((uVar8 == 0x47004a03) || (uVar8 == 0x5a5a5a5a)) {
        DVar12 = DTS_SUBTYPE_EX;
      }
      else if (uVar8 != 0x655e315e) {
        DVar12 = DTS_SUBTYPE_OTHER;
      }
      this->m_hdType = DVar12;
      bVar2 = BitStreamReader::getBit(&reader);
      if (bVar2) {
        BitStreamReader::skipBits(&reader,2);
        uVar5 = BitStreamReader::getBits(&reader,3);
        if (this->pi_frame_length == 0) {
          this->pi_frame_length = (uVar5 & 0xff) * 0x200 + 0x200;
        }
        bVar3 = BitStreamReader::getBit(&reader);
        if (bVar3) {
          BitStreamReader::skipBits(&reader,0x12);
          BitStreamReader::skipBits(&reader,0x12);
        }
        uVar5 = BitStreamReader::getBits(&reader,3);
        uVar6 = BitStreamReader::getBits(&reader,3);
        uVar4 = (uVar4 & 0xff) + 1;
        iVar10 = (uVar5 & 0xff) + 1;
        iVar11 = iVar10;
        while (bVar3 = iVar11 != 0, iVar11 = iVar11 + -1, bVar3) {
          BitStreamReader::skipBits(&reader,uVar4);
        }
        for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
          for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
            if ((uVar5 & 1) == 0) {
              BitStreamReader::skipBits(&reader,8);
            }
          }
        }
        bVar3 = BitStreamReader::getBit(&reader);
        if (bVar3) {
          BitStreamReader::skipBits(&reader,2);
          uVar4 = BitStreamReader::getBits(&reader,2);
          uVar5 = BitStreamReader::getBits(&reader,2);
          iVar11 = (uVar5 & 0xff) + 1;
          while (bVar3 = iVar11 != 0, iVar11 = iVar11 + -1, bVar3) {
            BitStreamReader::skipBits(&reader,(uVar4 & 0xff) * 4 + 4);
          }
        }
        uVar4 = uVar6 + 1 & 0xff;
      }
      else {
        uVar4 = 1;
      }
      uVar5 = uVar4;
      while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
        BitStreamReader::skipBits(&reader,(uint)bVar1 * 4 + 0x10);
      }
      if ((uVar4 != 0) && (BitStreamReader::skipBits(&reader,0xc), bVar2)) {
        bVar1 = BitStreamReader::getBit(&reader);
        if (bVar1) {
          BitStreamReader::skipBits(&reader,4);
        }
        bVar1 = BitStreamReader::getBit(&reader);
        if (bVar1) {
          BitStreamReader::skipBits(&reader,0x18);
        }
        bVar1 = BitStreamReader::getBit(&reader);
        if (bVar1) {
          uVar4 = BitStreamReader::getBits(&reader,10);
          iVar11 = (uVar4 & 0xffff) + 1;
          while (bVar1 = iVar11 != 0, iVar11 = iVar11 + -1, bVar1) {
            BitStreamReader::skipBits(&reader,8);
          }
        }
        uVar5 = BitStreamReader::getBits(&reader,5);
        uVar6 = BitStreamReader::getBits(&reader,4);
        uVar4 = BitStreamReader::getBits(&reader,8);
        this->hd_pi_channels = (char)uVar4 + '\x01';
        bVar1 = BitStreamReader::getBit(&reader);
        uVar4 = 0;
        if (bVar1) {
          if ((2 < this->hd_pi_channels) &&
             (BitStreamReader::skipBit(&reader), 6 < this->hd_pi_channels)) {
            BitStreamReader::skipBit(&reader);
          }
          bVar1 = BitStreamReader::getBit(&reader);
          uVar4 = 0;
          if (bVar1) {
            uVar4 = BitStreamReader::getBits(&reader,2);
            uVar4 = BitStreamReader::getBits(&reader,(uVar4 & 0xff) * 4 + 4);
          }
        }
        iVar11 = dtshd_samplerate[uVar6 & 0xff];
        this->hd_pi_sample_rate = iVar11;
        this->hd_bitDepth = (uVar5 & 0xff) + 1;
        dVar13 = (double)iVar11;
        if (this->m_isCoreExists == false) {
          this->m_frameDuration = ((double)this->pi_frame_length * 5292000000.0) / dVar13;
        }
        if (this->m_hdType != DTS_SUBTYPE_MASTER_AUDIO) {
          lVar9 = lround((double)iVar7 * (dVar13 / (double)this->pi_frame_length) * 8.0);
          this->m_hdBitrate = (int)lVar9;
        }
        uVar5 = uVar4 >> 3 & 1;
        this->hd_pi_lfeCnt = uVar5;
        if ((uVar4 >> 0xc & 1) != 0) {
          this->hd_pi_lfeCnt = uVar5 + 1;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int DTSStreamReader::decodeHdInfo(uint8_t* buff, const uint8_t* end)
{
    try
    {
        BitStreamReader reader{};
        reader.setBuffer(buff + 5, end);  // skip 4 byte magic and 1 unknown byte
        int headerSize;
        int hdFrameSize;
        const auto nuSubStreamIndex = reader.getBits<uint8_t>(2);
        const bool isBlownUpHeader = reader.getBit();
        if (isBlownUpHeader)
        {
            headerSize = reader.getBits<uint16_t>(12) + 1;
            hdFrameSize = reader.getBits<int32_t>(20) + 1;
        }
        else
        {
            headerSize = reader.getBits<uint8_t>(8) + 1;
            hdFrameSize = reader.getBits<uint16_t>(16) + 1;
        }
        if (m_hdType == DTSHD_SUBTYPE::DTS_SUBTYPE_UNINITIALIZED)
        {
            if (buff + headerSize + 4 > end)
                return NOT_ENOUGH_BUFFER;
            const auto hdAudioData = reinterpret_cast<uint32_t*>(buff + headerSize);
            switch (my_ntohl(*hdAudioData))
            {
            case 0x41A29547:  // XLL
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_MASTER_AUDIO;
                break;
            case 0x655E315E:  // XBR
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_HIGH_RES;
                break;
            case 0x0A801921:  // LBR
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_EXPRESS;
                break;
            case 0x47004A03:  // XXCH
            case 0x5A5A5A5A:  // XCH
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_EX;
                break;
            case 0x1D95F262:  // X96
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_96;
                break;
            default:  // Core, Substream, Neo, Sensation...
                m_hdType = DTSHD_SUBTYPE::DTS_SUBTYPE_OTHER;
            }
        }
        else
            return hdFrameSize;

        uint8_t nuNumAssets = 1;
        const bool bStaticFieldsPresent = reader.getBit();
        if (bStaticFieldsPresent)
        {
            reader.skipBits(2);  // nuRefClockCode
            const auto nuExSSFrameDurationCode = reader.getBits<uint8_t>(3) + 1;
            if (pi_frame_length == 0)
                pi_frame_length = nuExSSFrameDurationCode << 9;

            if (reader.getBit())
            {
                reader.skipBits(18);  // nuTimeStamp, 18 high bits
                reader.skipBits(18);  // nuTimeStamp, 18 low bits
            }
            const auto nuNumAudioPresent = reader.getBits<uint8_t>(3) + 1;
            nuNumAssets = reader.getBits<uint8_t>(3) + 1;
            for (int i = 0; i < nuNumAudioPresent; i++) reader.skipBits(nuSubStreamIndex + 1);
            for (int i = 0; i < nuNumAudioPresent; i++)
            {
                for (int j = 0; j < nuSubStreamIndex + 1; j++)
                {
                    if ((j + 1) % 2)
                        reader.skipBits(8);
                }
            }
            if (reader.getBit())
            {
                reader.skipBits(2);  // nuMixMetadataAdjLevel
                const auto nuBits4MixOutMask = reader.getBits<uint8_t>(2) * 4 + 4;
                const auto nuNumMixOutConfigs = reader.getBits<uint8_t>(2) + 1;
                for (int i = 0; i < nuNumMixOutConfigs; i++) reader.skipBits(nuBits4MixOutMask);
            }
        }
        for (int i = 0; i < nuNumAssets; i++) reader.skipBits(isBlownUpHeader ? 20 : 16);

        // JCDR TODO: have a look at this loop: with the 'break', i is never incremented
        for (int i = 0; i < nuNumAssets; i++)
        {
            reader.skipBits(12);  // nuAssetDescriptorFSIZE - 1, DescriptorDataForAssetIndex
            if (bStaticFieldsPresent)
            {
                if (reader.getBit())     // AssetTypeDescrPresent
                    reader.skipBits(4);  // AssetTypeDescriptor

                if (reader.getBit())      // LanguageDescrPresent
                    reader.skipBits(24);  // LanguageDescriptor

                if (reader.getBit())  // bInfoTextPresent
                {
                    const auto nuInfoTextByteSize = reader.getBits<uint16_t>(10) + 1;
                    for (int j = 0; j < nuInfoTextByteSize; j++) reader.skipBits(8);
                }
                const auto nuBitResolution = reader.getBits<uint8_t>(5) + 1;
                const auto nuMaxSampleRate = reader.getBits<uint8_t>(4);
                hd_pi_channels = reader.getBits<uint8_t>(8) + 1;
                uint16_t nuSpkrActivityMask = 0;
                if (reader.getBit())  // bOne2OneMapChannels2Speakers
                {
                    if (hd_pi_channels > 2)
                        reader.skipBit();  // bEmbeddedStereoFlag

                    if (hd_pi_channels > 6)
                        reader.skipBit();  // bEmbeddedSixChFlag

                    if (reader.getBit())  // bSpkrMaskEnabled
                    {
                        const auto nuNumBits4SAMask = reader.getBits<uint8_t>(2) * 4 + 4;
                        nuSpkrActivityMask = reader.getBits<uint16_t>(nuNumBits4SAMask);
                    }
                    // TODO...
                }
                hd_pi_sample_rate = dtshd_samplerate[nuMaxSampleRate];
                hd_bitDepth = nuBitResolution;

                if (!m_isCoreExists)
                    m_frameDuration = static_cast<double>(pi_frame_length) * INTERNAL_PTS_FREQ / hd_pi_sample_rate;

                if (m_hdType != DTSHD_SUBTYPE::DTS_SUBTYPE_MASTER_AUDIO)
                    m_hdBitrate = lround(static_cast<double>(hd_pi_sample_rate) / pi_frame_length * hdFrameSize * 8);

                hd_pi_lfeCnt = 0;

                if ((nuSpkrActivityMask & 0x8) == 0x8)
                    ++hd_pi_lfeCnt;

                if ((nuSpkrActivityMask & 0x1000) == 0x1000)
                    ++hd_pi_lfeCnt;
            }
            break;
        }
        return hdFrameSize;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}